

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartFpuControl.cpp
# Opt level: O0

void __thiscall SmartFPUControlT<true>::RestoreFPUControl(SmartFPUControlT<true> *this)

{
  errno_t eVar1;
  SmartFPUControlT<true> *this_local;
  
  if (this->m_oldFpuControl != 0xffffffff) {
    eVar1 = SetFPUControl(this->m_oldFpuControl);
    this->m_err = eVar1;
    this->m_oldFpuControl = 0xffffffff;
  }
  return;
}

Assistant:

void
SmartFPUControlT<enabled>::RestoreFPUControl()
{
    if (enabled)
    {
        if (m_oldFpuControl != INVALID_FPUCONTROL)
        {
            m_err = SetFPUControl(m_oldFpuControl);
            m_oldFpuControl = INVALID_FPUCONTROL; // Only restore once
        }
    }
    else
    {
        // Shouldn't restore if this is not enabled
        Assert(false);
    }
}